

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O0

void __thiscall CEffects::SkidTrail(CEffects *this,vec2 Pos,vec2 Vel)

{
  long lVar1;
  CParticle *in_RDI;
  long in_FS_OFFSET;
  CParticle p;
  CParticle *v;
  int Group;
  CParticles *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_Spr & 0x100) != 0) {
    v = in_RDI;
    CParticle::CParticle(in_RDI);
    CParticle::SetDefault(in_RDI);
    RandomDir();
    vector2_base<float>::operator*
              ((vector2_base<float> *)in_stack_ffffffffffffff70,(float)((ulong)v >> 0x20));
    vector2_base<float>::operator+((vector2_base<float> *)in_stack_ffffffffffffff70,&v->m_Pos);
    Group = (int)((ulong)v >> 0x20);
    random_float();
    random_float();
    random_float();
    vector4_base<float>::vector4_base
              ((vector4_base<float> *)&stack0xffffffffffffff70,0.75,0.75,0.75,1.0);
    CParticles::Add(in_stack_ffffffffffffff70,Group,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEffects::SkidTrail(vec2 Pos, vec2 Vel)
{
	if(!m_Add100hz)
		return;

	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_SMOKE;
	p.m_Pos = Pos;
	p.m_Vel = Vel + RandomDir()*50.0f;
	p.m_LifeSpan = 0.5f + random_float()*0.5f;
	p.m_StartSize = 24.0f + random_float()*12;
	p.m_EndSize = 0;
	p.m_Friction = 0.7f;
	p.m_Gravity = random_float()*-500.0f;
	p.m_Color = vec4(0.75f,0.75f,0.75f,1.0f);
	m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);
}